

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O1

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  size_t sVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  mode_t mVar5;
  wchar_t wVar6;
  int iVar7;
  archive_string_conv *paVar8;
  char *pcVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined4 *puVar16;
  la_int64_t lVar17;
  undefined8 *puVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  size_t copy_length;
  char *p;
  char buff [512];
  size_t local_258;
  archive_string *local_250;
  char *local_248;
  char *local_240;
  archive_string local_238 [4];
  byte abStack_1cf [9];
  undefined1 auStack_1c6 [6];
  undefined2 local_1c0;
  undefined1 auStack_1be [9];
  undefined4 uStack_1b5;
  undefined8 uStack_1b1;
  undefined4 uStack_1a9;
  undefined1 auStack_1a5 [9];
  undefined1 local_19c;
  undefined1 auStack_19b [363];
  
  plVar1 = (la_int64_t *)a->format_data;
  paVar8 = (archive_string_conv *)plVar1[2];
  if (paVar8 == (archive_string_conv *)0x0) {
    if ((int)plVar1[4] == 0) {
      paVar8 = archive_string_default_conversion_for_write(&a->archive);
      plVar1[3] = (la_int64_t)paVar8;
      *(undefined4 *)(plVar1 + 4) = 1;
    }
    paVar8 = (archive_string_conv *)plVar1[3];
  }
  pcVar9 = archive_entry_pathname(entry);
  if (pcVar9 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
    return -0x19;
  }
  pcVar9 = archive_entry_hardlink(entry);
  if (((pcVar9 != (char *)0x0) || (pcVar9 = archive_entry_symlink(entry), pcVar9 != (char *)0x0)) ||
     (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar5 = archive_entry_filetype(entry);
  if (((mVar5 == 0x4000) && (pcVar9 = archive_entry_pathname(entry), pcVar9 != (char *)0x0)) &&
     ((*pcVar9 != '\0' && (sVar10 = strlen(pcVar9), pcVar9[sVar10 - 1] != '/')))) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    sVar10 = strlen(pcVar9);
    local_250 = archive_string_ensure(local_238,sVar10 + 2);
    if (local_250 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
    }
    else {
      local_238[0].length = 0;
      archive_strncat(local_238,pcVar9,sVar10);
      archive_strappend_char(local_238,'/');
      archive_entry_copy_pathname(entry,local_238[0].s);
    }
    archive_string_free(local_238);
    if (local_250 == (archive_string *)0x0) {
      return -0x1e;
    }
  }
  memcpy(local_238,"",0x200);
  wVar6 = _archive_entry_pathname_l(entry,&local_240,&local_258,paVar8);
  if (wVar6 == L'\0') {
    iVar21 = 0;
LAB_0015d73e:
    if (local_258 < 100) {
      memcpy(local_238,local_240,local_258);
    }
    else {
      archive_set_error(&a->archive,0x24,"Pathname too long");
      iVar21 = -0x19;
    }
    wVar6 = _archive_entry_hardlink_l(entry,&local_248,&local_258,paVar8);
    if (wVar6 == L'\0') {
LAB_0015d7c7:
      sVar2 = local_258;
      if (local_258 == 0) {
        wVar6 = _archive_entry_symlink_l(entry,&local_248,&local_258,paVar8);
        local_250 = (archive_string *)CONCAT71(local_250._1_7_,0xff);
        if (wVar6 != L'\0') {
          piVar11 = __errno_location();
          pcVar9 = local_248;
          if (*piVar11 == 0xc) goto LAB_0015d90a;
          pcVar12 = archive_string_conversion_charset_name(paVar8);
          archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar12
                           );
          iVar21 = -0x14;
        }
      }
      else {
        local_250 = (archive_string *)CONCAT71(local_250._1_7_,0x31);
      }
      if (local_258 != 0) {
        if (99 < local_258) {
          archive_set_error(&a->archive,0x24,"Link contents too long");
          local_258 = 100;
          iVar21 = -0x19;
        }
        memcpy(auStack_19b,local_248,local_258);
      }
      mVar5 = archive_entry_mode(entry);
      uVar19 = 7;
      uVar13 = (ulong)(mVar5 & 0xfff);
      puVar3 = (undefined4 *)((long)abStack_1cf + 1);
      do {
        puVar16 = puVar3;
        uVar14 = uVar13;
        *(byte *)((long)puVar16 + -1) = (byte)uVar14 & 7 | 0x30;
        uVar19 = uVar19 - 1;
        uVar13 = uVar14 >> 3;
        puVar3 = (undefined4 *)((long)puVar16 + -1);
      } while (1 < uVar19);
      if (7 < uVar14) {
        *(undefined2 *)((long)puVar16 + 3) = 0x3737;
        *(undefined4 *)((long)puVar16 + -1) = 0x37373737;
        archive_set_error(&a->archive,0x22,"Numeric mode too large");
        iVar21 = -0x19;
      }
      uVar13 = archive_entry_uid(entry);
      if ((long)uVar13 < 0) {
        abStack_1cf[7] = 0x30;
        abStack_1cf[8] = 0x30;
        abStack_1cf[3] = 0x30;
        abStack_1cf[4] = 0x30;
        abStack_1cf[5] = 0x30;
        abStack_1cf[6] = 0x30;
LAB_0015d93f:
        archive_set_error(&a->archive,0x22,"Numeric user ID too large");
        iVar21 = -0x19;
      }
      else {
        uVar19 = 7;
        puVar3 = (undefined4 *)auStack_1c6;
        do {
          puVar16 = puVar3;
          uVar14 = uVar13;
          *(byte *)((long)puVar16 + -1) = (byte)uVar14 & 7 | 0x30;
          uVar19 = uVar19 - 1;
          uVar13 = uVar14 >> 3;
          puVar3 = (undefined4 *)((long)puVar16 + -1);
        } while (1 < uVar19);
        if (7 < uVar14) {
          *(undefined2 *)((long)puVar16 + 3) = 0x3737;
          *(undefined4 *)((long)puVar16 + -1) = 0x37373737;
          goto LAB_0015d93f;
        }
      }
      uVar13 = archive_entry_gid(entry);
      if ((long)uVar13 < 0) {
        local_1c0 = 0x3030;
        auStack_1c6._2_4_ = 0x30303030;
LAB_0015d9bc:
        archive_set_error(&a->archive,0x22,"Numeric group ID too large");
        iVar21 = -0x19;
      }
      else {
        uVar19 = 7;
        puVar3 = (undefined4 *)auStack_1be;
        do {
          puVar16 = puVar3;
          uVar14 = uVar13;
          *(byte *)((long)puVar16 + -1) = (byte)uVar14 & 7 | 0x30;
          uVar19 = uVar19 - 1;
          uVar13 = uVar14 >> 3;
          puVar3 = (undefined4 *)((long)puVar16 + -1);
        } while (1 < uVar19);
        if (7 < uVar14) {
          *(undefined2 *)((long)puVar16 + 3) = 0x3737;
          *(undefined4 *)((long)puVar16 + -1) = 0x37373737;
          goto LAB_0015d9bc;
        }
      }
      uVar13 = archive_entry_size(entry);
      if ((long)uVar13 < 0) {
        auStack_1be._2_7_ = 0x30303030303030;
        uStack_1b5 = 0x30303030;
LAB_0015da49:
        archive_set_error(&a->archive,0x22,"File size out of range");
        iVar21 = -0x19;
      }
      else {
        uVar19 = 0xc;
        puVar4 = &uStack_1b1;
        do {
          puVar18 = puVar4;
          uVar14 = uVar13;
          *(byte *)((long)puVar18 + -1) = (byte)uVar14 & 7 | 0x30;
          uVar19 = uVar19 - 1;
          uVar13 = uVar14 >> 3;
          puVar4 = (undefined8 *)((long)puVar18 + -1);
        } while (1 < uVar19);
        if (7 < uVar14) {
          *(undefined8 *)((long)puVar18 + -1) = 0x3737373737373737;
          *(undefined4 *)((long)puVar18 + 6) = 0x37373737;
          goto LAB_0015da49;
        }
      }
      uVar13 = archive_entry_mtime(entry);
      if ((long)uVar13 < 0) {
        uStack_1b1._1_7_ = 0x30303030303030;
        uStack_1a9 = 0x30303030;
LAB_0015dad6:
        archive_set_error(&a->archive,0x22,"File modification time too large");
        iVar21 = -0x19;
      }
      else {
        uVar19 = 0xc;
        puVar4 = (undefined8 *)auStack_1a5;
        do {
          puVar18 = puVar4;
          uVar14 = uVar13;
          *(byte *)((long)puVar18 + -1) = (byte)uVar14 & 7 | 0x30;
          uVar19 = uVar19 - 1;
          uVar13 = uVar14 >> 3;
          puVar4 = (undefined8 *)((long)puVar18 + -1);
        } while (1 < uVar19);
        if (7 < uVar14) {
          *(undefined8 *)((long)puVar18 + -1) = 0x3737373737373737;
          *(undefined4 *)((long)puVar18 + 6) = 0x37373737;
          goto LAB_0015dad6;
        }
      }
      if (sVar2 == 0) {
        mVar5 = archive_entry_filetype(entry);
        if ((mVar5 != 0x4000) && (mVar5 != 0x8000)) {
          if (mVar5 == 0xa000) {
            local_19c = 0x32;
          }
          else {
            __archive_write_entry_filetype_unsupported(&a->archive,entry,"v7tar");
            iVar21 = -0x19;
          }
        }
      }
      else {
        local_19c = local_250._0_1_;
      }
      lVar15 = 0;
      uVar19 = 0;
      do {
        uVar19 = uVar19 + *(byte *)((long)&local_238[0].s + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x200);
      uVar20 = 7;
      puVar3 = (undefined4 *)(auStack_1a5 + 7);
      uVar13 = (ulong)uVar19;
      do {
        uVar14 = uVar13;
        puVar16 = puVar3;
        *(byte *)((long)puVar16 + -1) = (byte)uVar14 & 7 | 0x30;
        uVar20 = uVar20 - 1;
        puVar3 = (undefined4 *)((long)puVar16 + -1);
        uVar13 = uVar14 >> 3;
      } while (1 < uVar20);
      if (7 < uVar14) {
        *(undefined2 *)((long)puVar16 + 3) = 0x3737;
        *(undefined4 *)((long)puVar16 + -1) = 0x37373737;
      }
      auStack_1a5[7] = 0;
      goto LAB_0015db63;
    }
    piVar11 = __errno_location();
    pcVar9 = local_248;
    if (*piVar11 != 0xc) {
      pcVar12 = archive_string_conversion_charset_name(paVar8);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar12);
      iVar21 = -0x14;
      goto LAB_0015d7c7;
    }
LAB_0015d90a:
    pcVar9 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar11 = __errno_location();
    pcVar9 = local_240;
    if (*piVar11 != 0xc) {
      pcVar12 = archive_string_conversion_charset_name(paVar8);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar9,pcVar12);
      iVar21 = -0x14;
      goto LAB_0015d73e;
    }
    pcVar9 = "Can\'t allocate memory for Pathname";
  }
  archive_set_error(&a->archive,0xc,pcVar9);
  iVar21 = -0x1e;
LAB_0015db63:
  if (-0x15 < iVar21) {
    iVar7 = __archive_write_output(a,local_238,0x200);
    if (iVar7 < -0x14) {
      archive_entry_free((archive_entry *)0x0);
      return iVar7;
    }
    if (iVar7 < iVar21) {
      iVar21 = iVar7;
    }
    lVar17 = archive_entry_size(entry);
    *plVar1 = lVar17;
    plVar1[1] = (ulong)(-(int)lVar17 & 0x1ff);
  }
  archive_entry_free((archive_entry *)0x0);
  return iVar21;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	archive_entry_free(entry_main);
	return (ret);
}